

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O1

ll_elem * ll_succ(ll_head *q_head,ll_elem *n)

{
  atomic_size_t *paVar1;
  atomic_size_t aVar2;
  ll_elem *plVar3;
  ll_head *plVar4;
  
  plVar3 = succ(q_head,n);
  plVar4 = (ll_head *)((ulong)plVar3 & 0xfffffffffffffffc);
  if (plVar4 == q_head) {
    LOCK();
    paVar1 = &(plVar4->q).refcnt;
    aVar2 = *paVar1;
    *paVar1 = *paVar1 - 1;
    UNLOCK();
    if (aVar2 == 0) {
      __assert_fail("old >= count",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x9a
                    ,"void deref_release(struct ll_head *, struct ll_elem *, size_t)");
    }
    plVar4 = (ll_head *)0x0;
  }
  return &plVar4->q;
}

Assistant:

struct ll_elem*
ll_succ(struct ll_head *q_head, struct ll_elem *n)
{
	struct ll_elem	*s;

	s = succ(q_head, n);

	/* Clean away the flag bits. */
	s = ptr_clear(s);
	if (s == &q_head->q) {
		/* Don't return q: it is not an element of the list. */
		deref_release(q_head, s, 1);
		s = NULL;
	}
	return s;
}